

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_processing.c
# Opt level: O0

void data_processing(arm7tdmi_t *state,arminstr_t *arminstr)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  ulong uVar4;
  status_register_t *psVar5;
  uint *in_RSI;
  arm7tdmi_t *in_RDI;
  uint64_t tmp_1;
  uint64_t tmp;
  uint64_t newvalue64;
  uint64_t op2c;
  uint32_t *to_set;
  uint32_t newvalue;
  status_register_t *cpsr;
  nonimmediate_flags_t flags;
  uint8_t shift_amount;
  uint32_t shift;
  uint32_t rndata;
  uint32_t operand2;
  uint8_t carry;
  uint8_t rd;
  uint8_t rn;
  _Bool s;
  data_processing_t *instr;
  uint32_t value_2;
  uint32_t value_1;
  uint32_t value;
  status_register_t *psr_15;
  status_register_t *psr_14;
  status_register_t *psr_13;
  status_register_t *psr_12;
  status_register_t *psr_11;
  status_register_t *psr_10;
  status_register_t *psr_9;
  status_register_t *psr_8;
  status_register_t *psr_7;
  status_register_t *psr_6;
  status_register_t *psr_5;
  status_register_t *psr_4;
  status_register_t *psr_3;
  status_register_t *psr_2;
  status_register_t *psr_1;
  status_register_t *psr;
  uint32_t result_2;
  uint32_t result;
  uint32_t result_1;
  uint32_t in_stack_fffffffffffffc1c;
  arm7tdmi_t *in_stack_fffffffffffffc20;
  status_register_t *in_stack_fffffffffffffc28;
  status_register_t *in_stack_fffffffffffffc30;
  arm7tdmi_t *state_00;
  arm7tdmi_t *in_stack_fffffffffffffc38;
  status_register_t *local_3c0;
  uint *local_368;
  uint local_35c;
  status_register_t *local_358;
  ushort local_350;
  byte local_349;
  uint local_348;
  uint local_344;
  uint local_340;
  byte local_33c;
  byte local_33b;
  byte local_33a;
  byte local_339;
  uint *local_338;
  arm7tdmi_t *local_328;
  uint32_t local_320;
  uint local_31c;
  uint local_310;
  uint local_30c;
  uint local_300;
  uint local_2fc;
  status_register_t *local_2f0;
  uint local_2e4;
  arm7tdmi_t *local_2e0;
  status_register_t *local_2d8;
  uint local_2cc;
  arm7tdmi_t *local_2c8;
  status_register_t *local_2c0;
  uint local_2b4;
  arm7tdmi_t *local_2b0;
  status_register_t *local_2a8;
  uint local_29c;
  arm7tdmi_t *local_298;
  status_register_t *local_290;
  uint local_284;
  arm7tdmi_t *local_280;
  status_register_t *local_278;
  uint local_26c;
  arm7tdmi_t *local_268;
  status_register_t *local_260;
  uint local_254;
  arm7tdmi_t *local_250;
  status_register_t *local_248;
  uint local_23c;
  arm7tdmi_t *local_238;
  status_register_t *local_230;
  uint local_224;
  arm7tdmi_t *local_220;
  status_register_t *local_218;
  uint local_20c;
  arm7tdmi_t *local_208;
  status_register_t *local_200;
  uint local_1f4;
  arm7tdmi_t *local_1f0;
  status_register_t *local_1e8;
  uint local_1dc;
  arm7tdmi_t *local_1d8;
  status_register_t *local_1d0;
  uint local_1c4;
  arm7tdmi_t *local_1c0;
  status_register_t *local_1b8;
  uint local_1ac;
  arm7tdmi_t *local_1a8;
  status_register_t *local_1a0;
  uint local_194;
  arm7tdmi_t *local_190;
  status_register_t *local_188;
  uint local_17c;
  arm7tdmi_t *local_178;
  uint local_16c;
  uint local_168;
  uint local_164;
  arm7tdmi_t *local_160;
  uint local_154;
  uint local_150;
  uint local_14c;
  arm7tdmi_t *local_148;
  uint local_13c;
  uint local_138;
  uint local_134;
  arm7tdmi_t *local_130;
  uint local_124;
  ulong local_120;
  ulong local_118;
  arm7tdmi_t *local_110;
  uint local_104;
  ulong local_100;
  ulong local_f8;
  arm7tdmi_t *local_f0;
  uint local_e8;
  byte local_e1;
  ulong local_e0;
  ulong local_d8;
  arm7tdmi_t *local_d0;
  uint local_c4;
  ulong local_c0;
  uint local_b8;
  uint local_b4;
  arm7tdmi_t *local_b0;
  uint local_a4;
  ulong local_a0;
  uint local_98;
  uint local_94;
  arm7tdmi_t *local_90;
  uint local_88;
  uint local_84;
  arm7tdmi_t *local_80;
  uint local_6c;
  uint local_5c;
  uint32_t local_4c;
  uint local_3c;
  uint local_2c;
  uint32_t local_20;
  
  local_339 = (byte)(*in_RSI >> 0x14) & 1;
  local_33a = (byte)(*in_RSI >> 0x10) & 0xf;
  local_33b = (byte)(*in_RSI >> 0xc) & 0xf;
  local_33c = (byte)((in_RDI->cpsr).raw >> 0x1d) & 1;
  if ((*in_RSI >> 0xc & 0xf) == 0xf) {
    local_339 = 0;
  }
  local_2fc = (uint)local_33a;
  local_300 = 0;
  if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < local_2fc)) && (local_2fc < 0xd)) {
    local_300 = in_RDI->highreg_fiq[local_2fc - 8];
  }
  else if (local_2fc < 0xd) {
    local_300 = in_RDI->r[local_2fc];
  }
  else if (local_2fc == 0xd) {
    switch((in_RDI->cpsr).raw & 0x1f) {
    case 0x11:
      local_6c = in_RDI->sp_fiq;
      break;
    case 0x12:
      local_6c = in_RDI->sp_irq;
      break;
    case 0x13:
      local_6c = in_RDI->sp_svc;
      break;
    default:
      local_6c = in_RDI->sp;
      break;
    case 0x17:
      local_6c = in_RDI->sp_abt;
      break;
    case 0x1b:
      local_6c = in_RDI->sp_und;
    }
    local_300 = local_6c;
  }
  else if (local_2fc == 0xe) {
    switch((in_RDI->cpsr).raw & 0x1f) {
    case 0x11:
      local_3c = in_RDI->lr_fiq;
      break;
    case 0x12:
      local_3c = in_RDI->lr_irq;
      break;
    case 0x13:
      local_3c = in_RDI->lr_svc;
      break;
    default:
      local_3c = in_RDI->lr;
      break;
    case 0x17:
      local_3c = in_RDI->lr_abt;
      break;
    case 0x1b:
      local_3c = in_RDI->lr_und;
    }
    local_300 = local_3c;
  }
  else {
    if (local_2fc != 0xf) {
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/../arm7tdmi.h"
              ,0xa4);
      fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)local_2fc);
      exit(1);
    }
    local_300 = in_RDI->pc;
  }
  local_344 = local_300;
  local_338 = in_RSI;
  local_328 = in_RDI;
  if ((*in_RSI >> 0x19 & 1) == 0) {
    uVar1 = (ushort)*in_RSI;
    uVar2 = local_350 & 0xf000 | uVar1 & 0xfff;
    local_350._0_1_ = (byte)(uVar1 & 0xfff);
    local_30c = (uint)((byte)local_350 & 0xf);
    local_310 = 0;
    local_350 = uVar2;
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < local_30c)) && (local_30c < 0xd)) {
      local_310 = in_RDI->highreg_fiq[local_30c - 8];
    }
    else if (local_30c < 0xd) {
      local_310 = in_RDI->r[local_30c];
    }
    else if (local_30c == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_5c = in_RDI->sp_fiq;
        break;
      case 0x12:
        local_5c = in_RDI->sp_irq;
        break;
      case 0x13:
        local_5c = in_RDI->sp_svc;
        break;
      default:
        local_5c = in_RDI->sp;
        break;
      case 0x17:
        local_5c = in_RDI->sp_abt;
        break;
      case 0x1b:
        local_5c = in_RDI->sp_und;
      }
      local_310 = local_5c;
    }
    else if (local_30c == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_2c = in_RDI->lr_fiq;
        break;
      case 0x12:
        local_2c = in_RDI->lr_irq;
        break;
      case 0x13:
        local_2c = in_RDI->lr_svc;
        break;
      default:
        local_2c = in_RDI->lr;
        break;
      case 0x17:
        local_2c = in_RDI->lr_abt;
        break;
      case 0x1b:
        local_2c = in_RDI->lr_und;
      }
      local_310 = local_2c;
    }
    else {
      if (local_30c != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/../arm7tdmi.h"
                ,0xa4);
        fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)local_30c);
        exit(1);
      }
      local_310 = in_RDI->pc;
    }
    local_340 = local_310;
    if ((((byte)local_350 >> 4 & 1) != 0) && (((byte)local_350 & 0xf) == 0xf)) {
      local_340 = local_310 + 4;
    }
    if (((byte)local_350 >> 4 & 1) == 0) {
      local_349 = (byte)(uVar2 >> 7) & 0x1f;
      if (2 < gba_log_verbosity) {
        printf("[DEBUG] Shift amount (immediate): 0x%02X\n",(ulong)local_349);
      }
    }
    else {
      if ((uVar1 & 0xf00) == 0xf00) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/data_processing.c"
                ,0x48);
        fprintf(_stderr,"UNIMPLEMENTED CASE DETECTED: %s\n\x1b[0;m","r15 is a special case");
        exit(1);
      }
      local_31c = (uint)((uVar1 & 0xf00) >> 8);
      local_320 = 0;
      if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < local_31c)) && (local_31c < 0xd)) {
        local_320 = in_RDI->highreg_fiq[local_31c - 8];
      }
      else if (local_31c < 0xd) {
        local_320 = in_RDI->r[local_31c];
      }
      else if (local_31c == 0xd) {
        switch((in_RDI->cpsr).raw & 0x1f) {
        case 0x11:
          local_4c = in_RDI->sp_fiq;
          break;
        case 0x12:
          local_4c = in_RDI->sp_irq;
          break;
        case 0x13:
          local_4c = in_RDI->sp_svc;
          break;
        default:
          local_4c = in_RDI->sp;
          break;
        case 0x17:
          local_4c = in_RDI->sp_abt;
          break;
        case 0x1b:
          local_4c = in_RDI->sp_und;
        }
        local_320 = local_4c;
      }
      else if (local_31c == 0xe) {
        switch((in_RDI->cpsr).raw & 0x1f) {
        case 0x11:
          local_20 = in_RDI->lr_fiq;
          break;
        case 0x12:
          local_20 = in_RDI->lr_irq;
          break;
        case 0x13:
          local_20 = in_RDI->lr_svc;
          break;
        default:
          local_20 = in_RDI->lr;
          break;
        case 0x17:
          local_20 = in_RDI->lr_abt;
          break;
        case 0x1b:
          local_20 = in_RDI->lr_und;
        }
        local_320 = local_20;
      }
      else {
        if (local_31c != 0xf) {
          fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                  "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/../arm7tdmi.h"
                  ,0xa4);
          fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)local_31c);
          exit(1);
        }
        local_320 = in_RDI->pc;
      }
      local_349 = (byte)local_320;
      if (2 < gba_log_verbosity) {
        printf("[DEBUG] Shift amount (r%d): 0x%02X\n",(ulong)((uVar1 & 0xf00) >> 8),(ulong)local_349
              );
      }
      if (local_33a == 0xf) {
        local_344 = local_344 + 4;
      }
    }
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Operand before shift: 0x%08X\n",(ulong)local_340);
    }
    if ((local_339 & 1) == 0) {
      local_3c0 = (status_register_t *)0x0;
    }
    else {
      local_3c0 = &local_328->cpsr;
    }
    local_358 = local_3c0;
    if ((((byte)local_350 >> 4 & 1) == 0) && (local_349 == 0)) {
      local_340 = arm_shift_special_zero_behavior
                            (in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
                             (shift_type_t)((ulong)in_stack_fffffffffffffc28 >> 0x20),
                             (uint32_t)in_stack_fffffffffffffc28);
    }
    else {
      local_340 = arm_shift(in_stack_fffffffffffffc28,
                            (shift_type_t)((ulong)in_stack_fffffffffffffc20 >> 0x20),
                            (uint32_t)in_stack_fffffffffffffc20,in_stack_fffffffffffffc1c);
    }
  }
  else {
    local_340 = *in_RSI & 0xff;
    local_348 = (*in_RSI & 0xf00) >> 7;
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Shift amount: %d\n",(ulong)local_348);
    }
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Operand2 before shift: %d\n",(ulong)local_340);
    }
    local_348 = local_348 & 0x1f;
    if ((local_348 != 0) &&
       (local_340 = local_340 >> (sbyte)local_348 | local_340 << (-(sbyte)local_348 & 0x1fU),
       (local_339 & 1) != 0)) {
      (local_328->cpsr).raw =
           (local_328->cpsr).raw & 0xdfffffff | (uint)((int)local_340 < 0) << 0x1d;
    }
  }
  if (2 < gba_log_verbosity) {
    printf("[DEBUG] Operand after shift: 0x%08X\n",(ulong)local_340);
  }
  if (2 < gba_log_verbosity) {
    printf("[DEBUG] Doing data processing opcode %X\n",(ulong)(*local_338 >> 0x15 & 0xf));
  }
  local_368 = (uint *)0x0;
  switch(*local_338 >> 0x15 & 0xf) {
  case 0:
    local_35c = local_344 & local_340;
    if ((local_339 & 1) != 0) {
      local_178 = local_328;
      local_17c = local_35c;
      local_188 = get_psr(local_328);
      local_188->raw = local_188->raw & 0xbfffffff | (uint)(local_17c == 0) << 0x1e;
      local_188->raw = local_188->raw & 0x7fffffff | (uint)((int)local_17c < 0) << 0x1f;
    }
    local_368 = &local_35c;
    break;
  case 1:
    local_35c = local_344 ^ local_340;
    if ((local_339 & 1) != 0) {
      local_190 = local_328;
      local_194 = local_35c;
      local_1a0 = get_psr(local_328);
      local_1a0->raw = local_1a0->raw & 0xbfffffff | (uint)(local_194 == 0) << 0x1e;
      local_1a0->raw = local_1a0->raw & 0x7fffffff | (uint)((int)local_194 < 0) << 0x1f;
    }
    local_368 = &local_35c;
    break;
  case 2:
    local_35c = local_344 - local_340;
    if ((local_339 & 1) != 0) {
      local_1a8 = local_328;
      local_1ac = local_35c;
      local_1b8 = get_psr(local_328);
      local_1b8->raw = local_1b8->raw & 0xbfffffff | (uint)(local_1ac == 0) << 0x1e;
      local_1b8->raw = local_1b8->raw & 0x7fffffff | (uint)((int)local_1ac < 0) << 0x1f;
      local_130 = local_328;
      local_134 = local_344;
      local_138 = local_340;
      local_13c = local_35c;
      (local_328->cpsr).raw =
           (local_328->cpsr).raw & 0xdfffffff | (uint)(local_340 <= local_344) << 0x1d;
      (local_328->cpsr).raw =
           (local_328->cpsr).raw & 0xefffffff |
           (uint)((int)((local_344 ^ local_340) & (local_340 ^ 0xffffffff ^ local_35c)) < 0) << 0x1c
      ;
    }
    local_368 = &local_35c;
    break;
  case 3:
    local_35c = local_340 - local_344;
    if ((local_339 & 1) != 0) {
      local_1c0 = local_328;
      local_1c4 = local_35c;
      local_1d0 = get_psr(local_328);
      local_1d0->raw = local_1d0->raw & 0xbfffffff | (uint)(local_1c4 == 0) << 0x1e;
      local_1d0->raw = local_1d0->raw & 0x7fffffff | (uint)((int)local_1c4 < 0) << 0x1f;
      local_148 = local_328;
      local_14c = local_340;
      local_150 = local_344;
      local_154 = local_35c;
      (local_328->cpsr).raw =
           (local_328->cpsr).raw & 0xdfffffff | (uint)(local_344 <= local_340) << 0x1d;
      (local_328->cpsr).raw =
           (local_328->cpsr).raw & 0xefffffff |
           (uint)((int)((local_340 ^ local_344) & (local_344 ^ 0xffffffff ^ local_35c)) < 0) << 0x1c
      ;
    }
    local_368 = &local_35c;
    break;
  case 4:
    local_35c = local_344 + local_340;
    if ((local_339 & 1) != 0) {
      local_1d8 = local_328;
      local_1dc = local_35c;
      local_1e8 = get_psr(local_328);
      local_1e8->raw = local_1e8->raw & 0xbfffffff | (uint)(local_1dc == 0) << 0x1e;
      local_1e8->raw = local_1e8->raw & 0x7fffffff | (uint)((int)local_1dc < 0) << 0x1f;
      local_f8 = (ulong)local_344;
      local_100 = (ulong)local_340;
      local_f0 = local_328;
      local_104 = local_344 + local_340;
      (local_328->cpsr).raw =
           (local_328->cpsr).raw & 0xdfffffff | (uint)(0xffffffff < local_f8 + local_100) << 0x1d;
      (local_328->cpsr).raw =
           (local_328->cpsr).raw & 0xefffffff |
           (uint)(((ulong)(local_344 ^ local_104) & (local_f8 ^ 0xffffffffffffffff ^ local_100)) >>
                  0x1f != 0) << 0x1c;
    }
    local_368 = &local_35c;
    break;
  case 5:
    uVar3 = local_344 + local_340 + local_33c;
    if ((local_339 & 1) != 0) {
      local_1f0 = local_328;
      local_1f4 = uVar3;
      local_200 = get_psr(local_328);
      local_200->raw = local_200->raw & 0xbfffffff | (uint)(local_1f4 == 0) << 0x1e;
      local_200->raw = local_200->raw & 0x7fffffff | (uint)((int)local_1f4 < 0) << 0x1f;
      local_d8 = (ulong)local_340;
      local_e0 = (ulong)local_344;
      local_d0 = local_328;
      local_e1 = local_33c;
      local_e8 = local_340 + local_344 + (uint)local_33c;
      (local_328->cpsr).raw =
           (local_328->cpsr).raw & 0xdfffffff |
           (uint)(0xffffffff < local_d8 + local_e0 + (ulong)local_33c) << 0x1d;
      (local_328->cpsr).raw =
           (local_328->cpsr).raw & 0xefffffff |
           (uint)(((ulong)(local_340 ^ local_e8) & (local_d8 ^ 0xffffffffffffffff ^ local_e0)) >>
                  0x1f != 0) << 0x1c;
    }
    local_368 = &local_35c;
    local_35c = uVar3;
    break;
  case 6:
    uVar4 = ((ulong)local_340 - (ulong)local_33c) + 1;
    local_35c = local_344 - (int)uVar4;
    if ((local_339 & 1) != 0) {
      local_208 = local_328;
      local_20c = local_35c;
      local_218 = get_psr(local_328);
      local_218->raw = local_218->raw & 0xbfffffff | (uint)(local_20c == 0) << 0x1e;
      local_218->raw = local_218->raw & 0x7fffffff | (uint)((int)local_20c < 0) << 0x1f;
      local_90 = local_328;
      local_94 = local_344;
      local_98 = local_340;
      local_a4 = local_35c;
      (local_328->cpsr).raw =
           (local_328->cpsr).raw & 0xdfffffff | (uint)(uVar4 <= local_344) << 0x1d;
      (local_328->cpsr).raw =
           (local_328->cpsr).raw & 0xefffffff |
           (uint)((int)((local_344 ^ local_340) & (local_340 ^ 0xffffffff ^ local_35c)) < 0) << 0x1c
      ;
      local_a0 = uVar4;
    }
    local_368 = &local_35c;
    break;
  case 7:
    uVar4 = ((ulong)local_344 - (ulong)local_33c) + 1;
    local_35c = local_340 - (int)uVar4;
    if ((local_339 & 1) != 0) {
      local_220 = local_328;
      local_224 = local_35c;
      local_230 = get_psr(local_328);
      local_230->raw = local_230->raw & 0xbfffffff | (uint)(local_224 == 0) << 0x1e;
      local_230->raw = local_230->raw & 0x7fffffff | (uint)((int)local_224 < 0) << 0x1f;
      local_b0 = local_328;
      local_b4 = local_340;
      local_b8 = local_344;
      local_c4 = local_35c;
      (local_328->cpsr).raw =
           (local_328->cpsr).raw & 0xdfffffff | (uint)(uVar4 <= local_340) << 0x1d;
      (local_328->cpsr).raw =
           (local_328->cpsr).raw & 0xefffffff |
           (uint)((int)((local_340 ^ local_344) & (local_344 ^ 0xffffffff ^ local_35c)) < 0) << 0x1c
      ;
      local_c0 = uVar4;
    }
    local_368 = &local_35c;
    break;
  case 8:
    if ((local_339 & 1) == 0) {
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/data_processing.c"
              ,0xb7);
      fprintf(_stderr,"UNIMPLEMENTED CASE DETECTED: %s\n\x1b[0;m",
              "BUG DETECTED: s flag must be set for opcodes 0x8-0xB");
      exit(1);
    }
    local_23c = local_344 & local_340;
    local_238 = local_328;
    local_248 = get_psr(local_328);
    local_248->raw = local_248->raw & 0xbfffffff | (uint)(local_23c == 0) << 0x1e;
    local_248->raw = local_248->raw & 0x7fffffff | (uint)((int)local_23c < 0) << 0x1f;
    break;
  case 9:
    if ((local_339 & 1) == 0) {
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/data_processing.c"
              ,0xbc);
      fprintf(_stderr,"UNIMPLEMENTED CASE DETECTED: %s\n\x1b[0;m",
              "BUG DETECTED: s flag must be set for opcodes 0x8-0xB");
      exit(1);
    }
    local_254 = local_344 ^ local_340;
    local_250 = local_328;
    local_260 = get_psr(local_328);
    local_260->raw = local_260->raw & 0xbfffffff | (uint)(local_254 == 0) << 0x1e;
    local_260->raw = local_260->raw & 0x7fffffff | (uint)((int)local_254 < 0) << 0x1f;
    break;
  case 10:
    if ((local_339 & 1) == 0) {
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/data_processing.c"
              ,0xc1);
      fprintf(_stderr,"UNIMPLEMENTED CASE DETECTED: %s\n\x1b[0;m",
              "BUG DETECTED: s flag must be set for opcodes 0x8-0xB");
      exit(1);
    }
    local_35c = local_344 - local_340;
    local_268 = local_328;
    local_26c = local_35c;
    local_278 = get_psr(local_328);
    local_278->raw = local_278->raw & 0xbfffffff | (uint)(local_26c == 0) << 0x1e;
    local_278->raw = local_278->raw & 0x7fffffff | (uint)((int)local_26c < 0) << 0x1f;
    local_160 = local_328;
    local_164 = local_344;
    local_168 = local_340;
    local_16c = local_35c;
    (local_328->cpsr).raw =
         (local_328->cpsr).raw & 0xdfffffff | (uint)(local_340 <= local_344) << 0x1d;
    (local_328->cpsr).raw =
         (local_328->cpsr).raw & 0xefffffff |
         (uint)((int)((local_344 ^ local_340) & (local_340 ^ 0xffffffff ^ local_35c)) < 0) << 0x1c;
    break;
  case 0xb:
    if ((local_339 & 1) == 0) {
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/data_processing.c"
              ,200);
      fprintf(_stderr,"UNIMPLEMENTED CASE DETECTED: %s\n\x1b[0;m",
              "BUG DETECTED: s flag must be set for opcodes 0x8-0xB");
      exit(1);
    }
    local_35c = local_344 + local_340;
    local_280 = local_328;
    local_284 = local_35c;
    local_290 = get_psr(local_328);
    local_290->raw = local_290->raw & 0xbfffffff | (uint)(local_284 == 0) << 0x1e;
    local_290->raw = local_290->raw & 0x7fffffff | (uint)((int)local_284 < 0) << 0x1f;
    local_118 = (ulong)local_344;
    local_120 = (ulong)local_340;
    local_110 = local_328;
    local_124 = local_344 + local_340;
    (local_328->cpsr).raw =
         (local_328->cpsr).raw & 0xdfffffff | (uint)(0xffffffff < local_118 + local_120) << 0x1d;
    (local_328->cpsr).raw =
         (local_328->cpsr).raw & 0xefffffff |
         (uint)(((ulong)(local_344 ^ local_124) & (local_118 ^ 0xffffffffffffffff ^ local_120)) >>
                0x1f != 0) << 0x1c;
    break;
  case 0xc:
    local_35c = local_344 | local_340;
    if ((local_339 & 1) != 0) {
      local_298 = local_328;
      local_29c = local_35c;
      local_2a8 = get_psr(local_328);
      local_2a8->raw = local_2a8->raw & 0xbfffffff | (uint)(local_29c == 0) << 0x1e;
      local_2a8->raw = local_2a8->raw & 0x7fffffff | (uint)((int)local_29c < 0) << 0x1f;
    }
    local_368 = &local_35c;
    break;
  case 0xd:
    local_368 = &local_340;
    if ((local_339 & 1) != 0) {
      local_2b0 = local_328;
      local_2b4 = local_340;
      local_2c0 = get_psr(local_328);
      local_2c0->raw = local_2c0->raw & 0xbfffffff | (uint)(local_2b4 == 0) << 0x1e;
      local_2c0->raw = local_2c0->raw & 0x7fffffff | (uint)((int)local_2b4 < 0) << 0x1f;
    }
    break;
  case 0xe:
    local_35c = local_344 & (local_340 ^ 0xffffffff);
    if ((local_339 & 1) != 0) {
      local_2c8 = local_328;
      local_2cc = local_35c;
      local_2d8 = get_psr(local_328);
      local_2d8->raw = local_2d8->raw & 0xbfffffff | (uint)(local_2cc == 0) << 0x1e;
      local_2d8->raw = local_2d8->raw & 0x7fffffff | (uint)((int)local_2cc < 0) << 0x1f;
    }
    local_368 = &local_35c;
    break;
  case 0xf:
    local_35c = local_340 ^ 0xffffffff;
    if ((local_339 & 1) != 0) {
      local_2e0 = local_328;
      local_2e4 = local_35c;
      local_2f0 = get_psr(local_328);
      local_2f0->raw = local_2f0->raw & 0xbfffffff | (uint)(local_2e4 == 0) << 0x1e;
      local_2f0->raw = local_2f0->raw & 0x7fffffff | (uint)((int)local_2e4 < 0) << 0x1f;
    }
    local_368 = &local_35c;
    break;
  default:
    fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
            "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/data_processing.c"
            ,0xe6);
    fprintf(_stderr,"DATA_PROCESSING: unknown opcode: 0x%X\n\x1b[0;m",
            (ulong)(*local_338 >> 0x15 & 0xf));
    exit(1);
  }
  if ((local_33b == 0xf) && ((*local_338 >> 0x14 & 1) != 0)) {
    if (((local_328->cpsr).raw & 0x1f) == 0x10) {
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/data_processing.c"
              ,0xec);
      fprintf(_stderr,"rd == 15 with s bit set should not be used in user mode!\n\x1b[0;m");
      exit(1);
    }
    state_00 = local_328;
    psVar5 = get_spsr(local_328);
    set_psr(state_00,psVar5->raw);
    if ((((local_328->cpsr).raw >> 5 & 1) != 0) && (local_368 != (uint *)0x0)) {
      *local_368 = *local_368 | 1;
    }
  }
  if (local_368 != (uint *)0x0) {
    local_88 = *local_368;
    local_80 = local_328;
    local_84 = (uint)local_33b;
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)local_84,(ulong)local_88);
    }
    if (((((local_80->cpsr).raw & 0x1f) == 0x11) && (7 < local_84)) && (local_84 < 0xd)) {
      local_80->highreg_fiq[local_84 - 8] = local_88;
    }
    else if (local_84 < 0xd) {
      local_80->r[local_84] = local_88;
    }
    else if (local_84 == 0xd) {
      switch((local_80->cpsr).raw & 0x1f) {
      case 0x11:
        local_80->sp_fiq = local_88;
        break;
      case 0x12:
        local_80->sp_irq = local_88;
        break;
      case 0x13:
        local_80->sp_svc = local_88;
        break;
      default:
        local_80->sp = local_88;
        break;
      case 0x17:
        local_80->sp_abt = local_88;
        break;
      case 0x1b:
        local_80->sp_und = local_88;
      }
    }
    else if (local_84 == 0xe) {
      switch((local_80->cpsr).raw & 0x1f) {
      case 0x11:
        local_80->lr_fiq = local_88;
        break;
      case 0x12:
        local_80->lr_irq = local_88;
        break;
      case 0x13:
        local_80->lr_svc = local_88;
        break;
      default:
        local_80->lr = local_88;
        break;
      case 0x17:
        local_80->lr_abt = local_88;
        break;
      case 0x1b:
        local_80->lr_und = local_88;
      }
    }
    else {
      if (local_84 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/../arm7tdmi.h"
                ,0xeb);
        fprintf(_stderr,"Attempted to write unknown register: r%d\n\x1b[0;m",(ulong)local_84);
        exit(1);
      }
      if (((local_80->cpsr).raw >> 5 & 1) == 0) {
        set_pc(in_stack_fffffffffffffc20,in_stack_fffffffffffffc1c);
      }
      else {
        set_pc(in_stack_fffffffffffffc20,in_stack_fffffffffffffc1c);
      }
    }
  }
  return;
}

Assistant:

void data_processing(arm7tdmi_t* state, arminstr_t* arminstr) {
    data_processing_t* instr = &arminstr->parsed.DATA_PROCESSING;
    bool s = instr->s;
    byte rn = instr->rn;
    byte rd = instr->rd;
    byte carry = state->cpsr.C;


    if (instr->rd == 15) {
        s = false; // Don't update flags if we're dealing with the program counter
    }

    word operand2;

    word rndata = get_register(state, rn);

    if (instr->immediate) { // Operand2 comes from an immediate value
        operand2 = instr->operand2 & 0xFFu; // Last 8 bits of operand2 are the pre-shift value

        // first 4 bytes * 7 are the shift value
        // Only shift by 7 because we were going to multiply it by 2 anyway
        word shift = (instr->operand2 & 0xF00u) >> 7u;

        logdebug("Shift amount: %d", shift)
        logdebug("Operand2 before shift: %d", operand2)

        shift &= 31u;
        if (shift != 0) {
            operand2 = (operand2 >> shift) | (operand2 << (-shift & 31u));
            if (s) {
                state->cpsr.C = operand2 >> 31u;
            }
        }
    }
    else { // Operand2 comes from another register
        byte shift_amount;

        nonimmediate_flags_t flags;
        flags.raw = instr->operand2;

        //unimplemented(flags.rm == 15, "r15 is a special case")
        operand2 = get_register(state, flags.rm);
        if (flags.r && flags.rm == 15u) {
            operand2 += 4; // Special case for R15 when immediate
        }

        // Shift by register
        if (flags.r) {
            unimplemented(flags.shift_register.rs == 15, "r15 is a special case")
            shift_amount = get_register(state, flags.shift_register.rs) & 0xFFu; // Only lowest 8 bits used
            logdebug("Shift amount (r%d): 0x%02X", flags.shift_register.rs, shift_amount)
            if (rn == 15) {
                rndata += 4;
            }
        }
        // Shift by immediate
        else {
            shift_amount = flags.shift_immediate.shift_amount;
            logdebug("Shift amount (immediate): 0x%02X", shift_amount)
        }



        logdebug("Operand before shift: 0x%08X", operand2)

        // Only pass cpsr if it should be updated
        status_register_t* cpsr = s?&state->cpsr:NULL;

        // Special case when shifting by immediate 0
        if (!flags.r && shift_amount == 0) {
            operand2 = arm_shift_special_zero_behavior(state, cpsr, flags.shift_type, operand2);
        } else {
            operand2 = arm_shift(cpsr, flags.shift_type, operand2, shift_amount);
        }
    }

    logdebug("Operand after shift: 0x%08X", operand2)

    logdebug("Doing data processing opcode %X", instr->opcode)

    word newvalue;
    word* to_set = NULL;

    switch(instr->opcode) {
        case 0x0: { // AND logical: Rd = Rn AND Op2
            newvalue = rndata & operand2;
            if (s) { set_flags_nz(state, newvalue); }
            to_set = &newvalue;
            break;
        }
        case 0x1: { // XOR logical: Rd = Rn XOR Op2
            newvalue = rndata ^ operand2;
            if (s) { set_flags_nz(state, newvalue); }
            to_set = &newvalue;
            break;
        }
        case 0x2: { // SUB: Rd = Rn-Op2
            newvalue = rndata - operand2;
            if (s) {
                set_flags_nz(state, newvalue);
                set_flags_sub(state, rndata, operand2, newvalue);
            }
            to_set = &newvalue;
            break;
        }
        case 0x3: { // RSB (subtract reversed): Rd = Op2-Rn
            newvalue = operand2 - rndata;
            if (s) {
                set_flags_nz(state, newvalue);
                set_flags_sub(state, operand2, rndata, newvalue);
            }
            to_set = &newvalue;
            break;
        }
        case 0x4: { // ADD: Rd = Rn+Op2
            newvalue = rndata + operand2;
            if (s) {
                set_flags_nz(state, newvalue);
                set_flags_add(state, rndata, operand2);
            }
            to_set = &newvalue;
            break;
        }
        case 0x5: { // ADC: Rd = Rn+Op2+C
            uint64_t op2c = operand2 + carry;
            uint64_t newvalue64 = rndata + op2c;
            if (s) {
                set_flags_nz(state, newvalue64);
                set_flags_adc(state, operand2, rndata, carry);
            }
            newvalue = newvalue64;
            to_set = &newvalue;
            break;
        }
        case 0x6: { // SBC: Rd = Rn-Op2+C-1
            uint64_t tmp = operand2;
            tmp -= carry;
            tmp += 1;
            newvalue = rndata - tmp;
            if (s) {
                set_flags_nz(state, newvalue);
                set_flags_sbc(state, rndata, operand2, tmp, newvalue);
            }
            to_set = &newvalue;
            break;
        }
        case 0x7: { // RSC: RD = Op2-Rn+C-1
            uint64_t tmp = rndata;
            tmp -= carry;
            tmp += 1;
            newvalue = operand2 - tmp;
            if (s) {
                set_flags_nz(state, newvalue);
                set_flags_sbc(state, operand2, rndata, tmp, newvalue);
            }
            to_set = &newvalue;
            break;
        }
        case 0x8: { // TST: Void = Rn AND Op2
            unimplemented(!s, "BUG DETECTED: s flag must be set for opcodes 0x8-0xB")
            set_flags_nz(state, rndata & operand2);
            break;
        }
        case 0x9: { // TEQ: Void = Rn XOR Op2
            unimplemented(!s, "BUG DETECTED: s flag must be set for opcodes 0x8-0xB")
            set_flags_nz(state, rndata ^ operand2);
            break;
        }
        case 0xA: { // CMP: Void = Rn-Op2
            unimplemented(!s, "BUG DETECTED: s flag must be set for opcodes 0x8-0xB")
            newvalue = rndata - operand2;
            set_flags_nz(state, newvalue);
            set_flags_sub(state, rndata, operand2, newvalue);
            break;
        }
        case 0xB: { // CMN: Void = Rn+Op2
            unimplemented(!s, "BUG DETECTED: s flag must be set for opcodes 0x8-0xB")
            newvalue = rndata + operand2;
            set_flags_nz(state, newvalue);
            set_flags_add(state, rndata, operand2);
            break;
        }
        case 0xC: { // OR logical: Rd = Rn OR Op2
            newvalue = rndata | operand2;
            if (s) { set_flags_nz(state, newvalue); }
            to_set = &newvalue;
            break;
        }
        case 0xD: { // MOV: Rd = Op2
            to_set = &operand2;
            if (s) { set_flags_nz(state, operand2); }
            break;
        }
        case 0xE: { // BIC: Rd = Rn AND NOT Op2
            newvalue = rndata & (~operand2);
            if (s) { set_flags_nz(state, newvalue); }
            to_set = &newvalue;
            break;
        }
        case 0xF: { // NOT: Rd = NOT Op2
            newvalue = ~operand2;
            if (s) { set_flags_nz(state, newvalue); }
            to_set = &newvalue;
            break;
        }
        default:
            logfatal("DATA_PROCESSING: unknown opcode: 0x%X", instr->opcode)
    }

    // Because above we always set s to false if rd == 15, we have to use the original one from the instruction
    if (rd == 15 && instr->s) {
        if (state->cpsr.mode == MODE_USER) {
            logfatal("rd == 15 with s bit set should not be used in user mode!")
        }
        set_psr(state, get_spsr(state)->raw);
        if (state->cpsr.thumb && to_set) {
            *to_set |= 1;
        }
    }

    if (to_set) {
        set_register(state, rd, *to_set);
    }
}